

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void AnalyzeFunctionDefinitionArguments
               (ExpressionContext *ctx,IntrusiveList<SynFunctionArgument> arguments,
               TypeBase *parentType,TypeFunction *instance,SmallArray<ArgumentData,_8U> *argData)

{
  uint uVar1;
  TypeHandle *pTVar2;
  ScopeData *scope;
  TypeBase *type_00;
  SynIdentifier *name;
  TypeBase *this;
  bool bVar3;
  VariableData *this_00;
  bool *local_f8;
  TypeBase *local_c8;
  byte local_b9;
  TypeHandle *local_b8;
  ArgumentData local_b0;
  bool local_79;
  ArgumentData *pAStack_78;
  bool failed;
  ArgumentData *data;
  SynFunctionArgument *prevArg;
  TypeBase *pTStack_60;
  uint pos;
  TypeBase *type;
  ExprBase *initializer;
  SynFunctionArgument *argument;
  TypeHandle *pTStack_40;
  bool hadGenericArgument;
  TypeHandle *instanceArg;
  SmallArray<ArgumentData,_8U> *argData_local;
  TypeFunction *instance_local;
  TypeBase *parentType_local;
  ExpressionContext *ctx_local;
  IntrusiveList<SynFunctionArgument> arguments_local;
  
  arguments_local.head = arguments.tail;
  initializer = (ExprBase *)arguments.head;
  if (instance == (TypeFunction *)0x0) {
    local_b8 = (TypeHandle *)0x0;
  }
  else {
    local_b8 = (instance->arguments).head;
  }
  pTStack_40 = local_b8;
  if (parentType == (TypeBase *)0x0) {
    local_b9 = 0;
  }
  else {
    local_b9 = parentType->isGeneric;
  }
  argument._7_1_ = local_b9 & 1;
  instanceArg = (TypeHandle *)argData;
  argData_local = (SmallArray<ArgumentData,_8U> *)instance;
  instance_local = (TypeFunction *)parentType;
  parentType_local = (TypeBase *)ctx;
  ctx_local = (ExpressionContext *)initializer;
  for (; initializer != (ExprBase *)0x0;
      initializer = (ExprBase *)
                    getType<SynFunctionArgument>((SynBase *)initializer[1]._vptr_ExprBase)) {
    if (initializer[1].next == (ExprBase *)0x0) {
      local_c8 = (TypeBase *)0x0;
    }
    else {
      local_c8 = (TypeBase *)
                 AnalyzeExpression((ExpressionContext *)parentType_local,
                                   (SynBase *)initializer[1].next);
    }
    type = local_c8;
    pTStack_60 = (TypeBase *)0x0;
    if (argData_local == (SmallArray<ArgumentData,_8U> *)0x0) {
      ExpressionContext::PushTemporaryScope((ExpressionContext *)parentType_local);
      prevArg._4_4_ = 0;
      for (data = (ArgumentData *)ctx_local; uVar1 = prevArg._4_4_,
          data != (ArgumentData *)0x0 && (ExprBase *)data != initializer;
          data = (ArgumentData *)getType<SynFunctionArgument>(data[1].source)) {
        prevArg._4_4_ = prevArg._4_4_ + 1;
        pAStack_78 = SmallArray<ArgumentData,_8U>::operator[]
                               ((SmallArray<ArgumentData,_8U> *)instanceArg,uVar1);
        this = parentType_local;
        this_00 = ExpressionContext::get<VariableData>((ExpressionContext *)parentType_local);
        pTVar2 = parentType_local[0x170].arrayTypes.tail;
        scope = (ScopeData *)parentType_local[0x158].unsizedArrayType;
        type_00 = pAStack_78->type;
        name = pAStack_78->name;
        uVar1 = *(uint *)((long)&parentType_local[0x170].size + 4);
        *(uint *)((long)&parentType_local[0x170].size + 4) = uVar1 + 1;
        VariableData::VariableData
                  (this_00,(Allocator *)pTVar2,(SynBase *)data,scope,0,type_00,name,0,uVar1);
        ExpressionContext::AddVariable((ExpressionContext *)this,this_00,true);
      }
      local_79 = false;
      if ((argument._7_1_ & 1) == 0) {
        local_f8 = (bool *)0x0;
      }
      else {
        local_f8 = &local_79;
      }
      pTStack_60 = AnalyzeType((ExpressionContext *)parentType_local,initializer[1].source,true,
                               local_f8);
      if (pTStack_60 == (TypeBase *)parentType_local[0x170].name.end) {
        if (type == (TypeBase *)0x0) {
          anon_unknown.dwarf_e7629::Stop
                    ((ExpressionContext *)parentType_local,initializer[1].source,
                     "ERROR: function argument cannot be an auto type");
        }
        type = (TypeBase *)
               ResolveInitializerValue
                         ((ExpressionContext *)parentType_local,(SynBase *)initializer,
                          (ExprBase *)type);
        pTStack_60 = (TypeBase *)(type->name).end;
      }
      else if ((((type != (TypeBase *)0x0) &&
                (bVar3 = isType<TypeError>((TypeBase *)(type->name).end), !bVar3)) &&
               ((pTStack_60->isGeneric & 1U) == 0)) &&
              (bVar3 = isType<TypeError>(pTStack_60), !bVar3)) {
        CreateCast((ExpressionContext *)parentType_local,initializer[1].source,(ExprBase *)type,
                   pTStack_60,true);
      }
      if (pTStack_60 == (TypeBase *)parentType_local[0x16f].name.end) {
        anon_unknown.dwarf_e7629::Stop
                  ((ExpressionContext *)parentType_local,initializer[1].source,
                   "ERROR: function argument cannot be a void type");
      }
      argument._7_1_ = (argument._7_1_ & 1) != 0 || (pTStack_60->isGeneric & 1U) != 0;
      ExpressionContext::PopScope((ExpressionContext *)parentType_local,SCOPE_TEMPORARY);
    }
    else {
      pTStack_60 = pTStack_40->type;
      pTStack_40 = pTStack_40->next;
    }
    pTVar2 = instanceArg;
    ArgumentData::ArgumentData
              (&local_b0,(SynBase *)initializer,
               (bool)(*(byte *)((long)&initializer[1].typeID + 2) & 1),
               (SynIdentifier *)initializer[1].type,pTStack_60,(ExprBase *)type);
    SmallArray<ArgumentData,_8U>::push_back((SmallArray<ArgumentData,_8U> *)pTVar2,&local_b0);
  }
  return;
}

Assistant:

void AnalyzeFunctionDefinitionArguments(ExpressionContext &ctx, IntrusiveList<SynFunctionArgument> arguments, TypeBase *parentType, TypeFunction *instance, SmallArray<ArgumentData, 8> &argData)
{
	TypeHandle *instanceArg = instance ? instance->arguments.head : NULL;

	bool hadGenericArgument = parentType ? parentType->isGeneric : false;

	for(SynFunctionArgument *argument = arguments.head; argument; argument = getType<SynFunctionArgument>(argument->next))
	{
		ExprBase *initializer = argument->initializer ? AnalyzeExpression(ctx, argument->initializer) : NULL;

		TypeBase *type = NULL;

		if(instance)
		{
			type = instanceArg->type;

			instanceArg = instanceArg->next;
		}
		else
		{
			// Create temporary scope with known arguments for reference in type expression
			ctx.PushTemporaryScope();

			unsigned pos = 0;

			for(SynFunctionArgument *prevArg = arguments.head; prevArg && prevArg != argument; prevArg = getType<SynFunctionArgument>(prevArg->next))
			{
				ArgumentData &data = argData[pos++];

				ctx.AddVariable(new (ctx.get<VariableData>()) VariableData(ctx.allocator, prevArg, ctx.scope, 0, data.type, data.name, 0, ctx.uniqueVariableId++), true);
			}

			bool failed = false;
			type = AnalyzeType(ctx, argument->type, true, hadGenericArgument ? &failed : NULL);

			if(type == ctx.typeAuto)
			{
				if(!initializer)
					Stop(ctx, argument->type, "ERROR: function argument cannot be an auto type");

				initializer = ResolveInitializerValue(ctx, argument, initializer);

				type = initializer->type;
			}
			else if(initializer && !isType<TypeError>(initializer->type))
			{
				// Just a test
				if(!type->isGeneric && !isType<TypeError>(type))
					CreateCast(ctx, argument->type, initializer, type, true);
			}

			if(type == ctx.typeVoid)
				Stop(ctx, argument->type, "ERROR: function argument cannot be a void type");

			hadGenericArgument |= type->isGeneric;

			// Remove temporary scope
			ctx.PopScope(SCOPE_TEMPORARY);
		}

		argData.push_back(ArgumentData(argument, argument->isExplicit, argument->name, type, initializer));
	}
}